

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU.h
# Opt level: O2

bool __thiscall
Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>::
_solve<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>> *this,
          MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *B,
          MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *X_base)

{
  MappedSuperNodalMatrix<double,int> *this_00;
  SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>> *pSVar1;
  Index j;
  long lVar2;
  Index j_1;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_c0;
  SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>> *local_98;
  SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>> *local_90;
  long lStack_88;
  Nested local_78;
  Index IStack_70;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_68;
  SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>> *local_40;
  SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>> *local_38;
  
  if (this[5] != (SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>)0x0) {
    PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)X_base,
               *(Index *)(B + 8),*(Index *)(B + 0x10));
    local_40 = this + 0xe0;
    local_38 = this;
    for (lVar2 = 0; pSVar1 = local_38, lVar2 < *(long *)(B + 0x10); lVar2 = lVar2 + 1) {
      Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                (&local_68,(Matrix<double,__1,__1,_0,__1,__1> *)B,lVar2);
      local_98 = local_40;
      local_90 = (SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>> *)
                 local_68.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                 .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                 .m_data;
      lStack_88 = local_68.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                  .m_rows.m_value;
      local_78 = local_68.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                 .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                 .m_xpr;
      IStack_70 = local_68.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .m_outerStride;
      Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                (&local_c0,(Matrix<double,__1,__1,_0,__1,__1> *)X_base,lVar2);
      internal::
      permut_matrix_product_retval<Eigen::PermutationMatrix<-1,-1,int>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,1,false>
      ::evalTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                ((permut_matrix_product_retval<Eigen::PermutationMatrix<_1,_1,int>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,1,false>
                  *)&local_98,&local_c0);
    }
    this_00 = (MappedSuperNodalMatrix<double,int> *)(local_38 + 0x68);
    internal::MappedSuperNodalMatrix<double,int>::solveInPlace<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (this_00,X_base);
    local_90 = pSVar1 + 0xa8;
    local_98 = (SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>> *)this_00;
    SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>,Eigen::MappedSparseMatrix<double,0,int>>
    ::solveInPlace<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((SparseLUMatrixUReturnType<Eigen::internal::MappedSuperNodalMatrix<double,int>,Eigen::MappedSparseMatrix<double,0,int>>
                *)&local_98,X_base);
    local_38 = pSVar1 + 0xd0;
    for (lVar2 = 0; lVar2 < *(long *)(B + 0x10); lVar2 = lVar2 + 1) {
      Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                (&local_68,(Matrix<double,__1,__1,_0,__1,__1> *)X_base,lVar2);
      local_98 = local_38;
      local_90 = (SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>> *)
                 local_68.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                 .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                 .m_data;
      lStack_88 = local_68.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                  .m_rows.m_value;
      local_78 = local_68.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                 .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                 .m_xpr;
      IStack_70 = local_68.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .m_outerStride;
      Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                (&local_c0,(Matrix<double,__1,__1,_0,__1,__1> *)X_base,lVar2);
      internal::
      permut_matrix_product_retval<Eigen::PermutationMatrix<-1,-1,int>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,1,true>
      ::evalTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                ((permut_matrix_product_retval<Eigen::PermutationMatrix<_1,_1,int>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,1,true>
                  *)&local_98,&local_c0);
    }
    return true;
  }
  __assert_fail("m_factorizationIsOk && \"The matrix should be factorized first\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseLU/SparseLU.h"
                ,0xe1,
                "bool Eigen::SparseLU<Eigen::SparseMatrix<double>>::_solve(const MatrixBase<Rhs> &, MatrixBase<Dest> &) const [_MatrixType = Eigen::SparseMatrix<double>, _OrderingType = Eigen::COLAMDOrdering<int>, Rhs = Eigen::Matrix<double, -1, -1>, Dest = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

bool _solve(const MatrixBase<Rhs> &B, MatrixBase<Dest> &X_base) const
    {
      Dest& X(X_base.derived());
      eigen_assert(m_factorizationIsOk && "The matrix should be factorized first");
      EIGEN_STATIC_ASSERT((Dest::Flags&RowMajorBit)==0,
                        THIS_METHOD_IS_ONLY_FOR_COLUMN_MAJOR_MATRICES);
      
      // Permute the right hand side to form X = Pr*B
      // on return, X is overwritten by the computed solution
      X.resize(B.rows(),B.cols());

      // this ugly const_cast_derived() helps to detect aliasing when applying the permutations
      for(Index j = 0; j < B.cols(); ++j)
        X.col(j) = rowsPermutation() * B.const_cast_derived().col(j);
      
      //Forward substitution with L
      this->matrixL().solveInPlace(X);
      this->matrixU().solveInPlace(X);
      
      // Permute back the solution 
      for (Index j = 0; j < B.cols(); ++j)
        X.col(j) = colsPermutation().inverse() * X.col(j);
      
      return true; 
    }